

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperationsExecuter.h
# Opt level: O2

bool __thiscall
Refal2::COperationsExecuter::matchLeftWithQulifierBeginSaveToTable_V
          (COperationsExecuter *this,TQualifierIndex qualifier)

{
  CUnitNode *nodeA;
  bool bVar1;
  
  bVar1 = shiftLeft(this);
  if ((bVar1) && (bVar1 = checkQualifier(this,this->left,qualifier), bVar1)) {
    nodeA = this->left;
    if (((nodeA->super_CUnit).type & UT_LeftParen) != 0) {
      this->left = (CUnitNode *)(nodeA->super_CUnit).field_1;
    }
    this->operation = this->operation->next;
    saveState(this);
    saveToTable(this,nodeA,this->left);
    return true;
  }
  return false;
}

Assistant:

inline bool COperationsExecuter::matchLeftWithQulifierBeginSaveToTable_V(
	const TQualifierIndex qualifier )
{
	if( shiftLeft() && checkQualifier( left, qualifier ) ) {
		CUnitNode* tmp = left;
		if( left->IsLeftParen() ) {
			left = left->PairedParen();
		}
		nextOperation();
		saveState();
		saveToTable( tmp, left );
		return true;
	} else {
		return false;
	}
}